

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_path_(lyd_node *parent,ly_ctx *ctx,lysc_ext_instance *ext,char *path,void *value,
                    size_t value_len,LYD_ANYDATA_VALUETYPE value_type,uint32_t options,
                    lyd_node **new_parent,lyd_node **new_node)

{
  long *plVar1;
  int64_t *piVar2;
  uint16_t uVar3;
  ushort uVar4;
  long lVar5;
  ulong uVar6;
  LY_ERR LVar7;
  int iVar8;
  size_t sVar9;
  lysc_node *plVar10;
  lysc_ext_instance *plVar11;
  undefined8 *puVar12;
  ly_path_predicate *plVar13;
  ly_path *plVar14;
  lyd_value *val;
  lyd_node **first_sibling_p;
  lys_module *plVar15;
  lyd_node *plVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  LY_ERR LVar20;
  ly_ctx *ctx_00;
  uint uVar21;
  uint32_t hints;
  ly_path_predicate **pplVar22;
  ulong uVar23;
  ly_path_predicate *plVar24;
  lysc_ext_instance *plVar25;
  bool bVar26;
  lyd_node *node;
  LY_VALUE_FORMAT format;
  lysc_ext_instance *local_c0;
  ly_path *p;
  ly_path_predicate *local_b0;
  size_t local_a8;
  uint64_t path_idx;
  lyd_value *local_98;
  lyd_node *parent_local;
  lysc_ext_instance *local_88;
  ulong local_80;
  lyd_node *nparent;
  undefined8 local_70;
  lyd_node *nnode;
  lyxp_expr *exp;
  lyd_node *iter;
  lysc_type *plStack_50;
  anon_union_24_16_e2776397_for_lyd_value_2 local_48;
  
  exp = (lyxp_expr *)0x0;
  p = (ly_path *)0x0;
  nparent = (lyd_node *)0x0;
  nnode = (lyd_node *)0x0;
  node = (lyd_node *)0x0;
  path_idx = 0;
  parent_local = parent;
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    __assert_fail("parent || ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x686,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if ((parent == (lyd_node *)0x0) && (*path != '/')) {
    __assert_fail("path && ((path[0] == \'/\') || parent)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x687,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      plVar15 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar15 = parent->schema->module;
    }
    ctx = plVar15->ctx;
  }
  if (value_len == 0 && value != (void *)0x0) {
    value_len = strlen((char *)value);
  }
  LVar7 = lyd_new_val_get_format(options,&format);
  if (LVar7 != LY_SUCCESS) {
    plVar24 = (ly_path_predicate *)0x0;
    goto LAB_0012eab0;
  }
  local_a8 = value_len;
  sVar9 = strlen(path);
  plVar24 = (ly_path_predicate *)0x0;
  LVar7 = ly_path_parse(ctx,(lysc_node *)0x0,path,sVar9,'\0',2,0x40,0x200,&exp);
  if (LVar7 != LY_SUCCESS) goto LAB_0012eab0;
  plVar10 = lyd_node_schema(parent_local);
  plVar24 = (ly_path_predicate *)0x0;
  LVar7 = ly_path_compile(ctx,(lys_module *)0x0,plVar10,ext,exp,((ushort)options & 1) + 1,0x20,'\0',
                          LY_VALUE_JSON,(void *)0x0,&p);
  if (LVar7 != LY_SUCCESS) goto LAB_0012eab0;
  if (p == (ly_path *)0x0) {
    __assert_fail("path",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x61f,
                  "LY_ERR lyd_new_path_check_find_lypath(struct ly_path *, const char *, const char *, size_t, LY_VALUE_FORMAT, uint32_t)"
                 );
  }
  plVar24 = p[-1].predicates;
  plVar11 = (lysc_ext_instance *)p[-1].predicates;
  plVar14 = p;
  local_c0 = (lysc_ext_instance *)value;
  if (plVar11 == (lysc_ext_instance *)0x0) {
    bVar26 = true;
  }
  else {
    local_80 = (ulong)format;
    pplVar22 = &p->predicates;
    local_98 = (lyd_value *)((ulong)local_98 & 0xffffffff00000000);
    plVar25 = (lysc_ext_instance *)0x0;
    local_70 = p;
    LVar20 = options;
    local_b0 = plVar24;
    do {
      plVar10 = ((ly_path *)(pplVar22 + -2))->node;
      if (plVar10 == (lysc_node *)0x0) {
LAB_0012ebda:
        if (plVar10->nodetype == 8) {
          if (((*pplVar22 == (ly_path_predicate *)0x0) ||
              ((*pplVar22)->type != LY_PATH_PREDTYPE_LEAFLIST)) &&
             (((options & 0x40) == 0 ||
              (LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,(char *)local_c0,local_a8,
                                          (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
              plVar14 = local_70, LVar7 == LY_SUCCESS)))) {
            LVar7 = lyd_value_store(plVar10->module->ctx,(lyd_value *)&iter,
                                    (lysc_type *)plVar10[1].parent,local_c0,local_a8,'\0','\0',
                                    (ly_bool *)0x0,(LY_VALUE_FORMAT)local_80,(void *)0x0,0x3f3,
                                    plVar10,(ly_bool *)0x0);
            plVar24 = local_b0;
            if (LVar7 != LY_SUCCESS) goto LAB_0012ee9b;
            plStack_50->refcount = plStack_50->refcount + 1;
            plVar24 = *pplVar22;
            if (plVar24 == (ly_path_predicate *)0x0) {
              puVar12 = (undefined8 *)malloc(0x40);
              if (puVar12 != (undefined8 *)0x0) {
                *puVar12 = 1;
                goto LAB_0012ed21;
              }
LAB_0012ed2d:
              bVar26 = false;
              LVar20 = LY_EMEM;
              ly_log(plVar10->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
            }
            else {
              lVar5 = *(long *)((long)&plVar24[-1].field_1 + 0x28);
              *(long *)((long)&plVar24[-1].field_1 + 0x28) = lVar5 + 1;
              puVar12 = (undefined8 *)
                        realloc((void *)((long)&plVar24[-1].field_1 + 0x28),lVar5 * 0x38 + 0x40);
              if (puVar12 == (undefined8 *)0x0) {
                plVar1 = (long *)((long)&(*pplVar22)[-1].field_1 + 0x28);
                *plVar1 = *plVar1 + -1;
                goto LAB_0012ed2d;
              }
LAB_0012ed21:
              *pplVar22 = (ly_path_predicate *)(puVar12 + 1);
              bVar26 = true;
            }
            plVar24 = local_b0;
            LVar7 = LVar20;
            if (!bVar26) goto LAB_0012ee9b;
            plVar24 = *pplVar22;
            lVar5 = *(long *)((long)&plVar24[-1].field_1 + 0x28);
            *(undefined8 *)(plVar24 + lVar5 + -1) = 0;
            plVar24[lVar5 + -1].field_1.position = 0;
            puVar12 = (undefined8 *)((long)&plVar24[lVar5 + -1].field_1 + 0x18);
            *puVar12 = 0;
            puVar12[1] = 0;
            puVar12 = (undefined8 *)((long)&plVar24[lVar5 + -1].field_1 + 8);
            *puVar12 = 0;
            puVar12[1] = 0;
            *(undefined8 *)((long)&plVar24[lVar5 + -1].field_1 + 0x28) = 0;
            plVar24[lVar5 + -1].type = LY_PATH_PREDTYPE_LEAFLIST;
            puVar12 = (undefined8 *)((long)&plVar24[lVar5 + -1].field_1 + 8);
            *puVar12 = iter;
            puVar12[1] = plStack_50;
            piVar2 = (int64_t *)((long)&plVar24[lVar5 + -1].field_1 + 0x18);
            *piVar2 = local_48.dec64;
            piVar2[1] = local_48._8_8_;
            *(undefined8 *)((long)&plVar24[lVar5 + -1].field_1 + 0x28) = local_48._16_8_;
            plVar14 = local_70;
          }
        }
        else if (((plVar10->nodetype == 0x10) &&
                 ((*pplVar22 == (ly_path_predicate *)0x0 ||
                  ((*pplVar22)->type != LY_PATH_PREDTYPE_LIST)))) &&
                (((options & 0x40) == 0 ||
                 (plVar25 < (lysc_ext_instance *)((long)&plVar11[-1].compiled + 7U))))) {
          ly_log_location(plVar10,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          ctx_00 = plVar10->module->ctx;
          pcVar19 = lys_nodetype2str(plVar10->nodetype);
          pcVar17 = plVar10->name;
          pcVar18 = "Predicate missing for %s \"%s\" in path \"%s\".";
LAB_0012ee61:
          ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,pcVar18,pcVar19,pcVar17,path);
          ly_log_location_revert(1,0,0,0);
          plVar24 = local_b0;
          LVar7 = LY_EINVAL;
          goto LAB_0012ee9b;
        }
      }
      else {
        uVar3 = plVar10->nodetype;
        if (uVar3 != 8) {
          if ((uVar3 == 0x10) && ((plVar10->flags & 0x200) != 0)) goto LAB_0012ebad;
          goto LAB_0012ebda;
        }
        if ((plVar10->flags & 1) != 0) goto LAB_0012ebda;
LAB_0012ebad:
        plVar24 = *pplVar22;
        if ((plVar24 != (ly_path_predicate *)0x0) &&
           ((uVar3 != 8 || (plVar24->type != LY_PATH_PREDTYPE_LEAFLIST)))) {
          if (plVar24->type == LY_PATH_PREDTYPE_POSITION) goto LAB_0012edb8;
          ly_log_location(plVar10,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          ctx_00 = plVar10->module->ctx;
          pcVar19 = lys_nodetype2str(plVar10->nodetype);
          pcVar17 = plVar10->name;
          pcVar18 = "Invalid predicate for state %s \"%s\" in path \"%s\".";
          goto LAB_0012ee61;
        }
        local_98 = (lyd_value *)CONCAT44(local_98._4_4_,1);
        local_88 = plVar25;
      }
LAB_0012edb8:
      plVar25 = (lysc_ext_instance *)((long)&plVar25->def + 1);
      plVar11 = (lysc_ext_instance *)plVar14[-1].predicates;
      pplVar22 = pplVar22 + 3;
    } while (plVar25 < plVar11);
    bVar26 = (int)local_98 == 0;
    ext = local_88;
    plVar24 = local_b0;
  }
  LVar7 = LY_SUCCESS;
  if ((!bVar26) && (ext < (lysc_ext_instance *)plVar14[-1].predicates)) {
    plVar14[-1].predicates = (ly_path_predicate *)ext;
  }
LAB_0012ee9b:
  plVar11 = local_c0;
  if (LVar7 != LY_SUCCESS) goto LAB_0012eab0;
  if (parent_local != (lyd_node *)0x0) {
    LVar7 = ly_path_eval_partial
                      (p,parent_local,(lyxp_var *)0x0,(byte)options & 0x80,&path_idx,&node);
    if (LVar7 == LY_EINCOMPLETE) {
      path_idx = path_idx + 1;
    }
    else if (LVar7 == LY_ENOTFOUND) {
      if (p->node == (lysc_node *)0x0) {
        plVar10 = (lysc_node *)0x0;
      }
      else {
        plVar10 = p->node->parent;
      }
      plVar10 = lysc_data_node(plVar10);
      if (plVar10 != (lysc_node *)0x0) {
        node = parent_local;
      }
    }
    else {
      if (LVar7 != LY_SUCCESS) goto LAB_0012eab0;
      if (p == (ly_path *)0x0) {
        plVar13 = (ly_path_predicate *)0x0;
      }
      else {
        plVar13 = p[-1].predicates;
      }
      if (plVar24 == plVar13) {
        if ((options & 0x20) == 0) {
          if ((node->flags & 1) == 0) {
            ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
            LVar7 = LY_EEXIST;
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Path \"%s\" already exists.",path);
            ly_log_location_revert(0,1,0,0);
            goto LAB_0012eab0;
          }
        }
        else {
          plVar10 = node->schema;
          if (((plVar10 != (lysc_node *)0x0) && (plVar10->nodetype == 4)) &&
             ((plVar10->flags & 0x100) != 0)) {
LAB_0012f6d1:
            LVar7 = LY_SUCCESS;
            goto LAB_0012eab0;
          }
        }
        LVar7 = lyd_new_path_update(node,plVar11,local_a8,value_type,format,&nparent,&nnode);
        goto LAB_0012eab0;
      }
    }
  }
  local_70 = (ly_path *)(CONCAT44(local_70._4_4_,options >> 8) & 0xffffffff00ffff01);
  while( true ) {
    if (p == (ly_path *)0x0) {
      plVar13 = (ly_path_predicate *)0x0;
    }
    else {
      plVar13 = p[-1].predicates;
    }
    if (plVar24 <= plVar13) break;
    p[-1].predicates = (ly_path_predicate *)((long)&(p[-1].predicates)->type + 1);
  }
  if (p == (ly_path *)0x0) {
    plVar13 = (ly_path_predicate *)0x0;
  }
  else {
    plVar13 = p[-1].predicates;
  }
  if ((path_idx < plVar13) && (plVar10 = p[path_idx].node, plVar10 != (lysc_node *)0x0)) {
    if (plVar10->nodetype == 8) {
      if ((plVar10->flags & 1) == 0) goto LAB_0012f034;
    }
    else if ((plVar10->nodetype == 0x10) && ((plVar10->flags & 0x200) != 0)) {
LAB_0012f034:
      if ((p[path_idx].predicates != (ly_path_predicate *)0x0) &&
         ((p[path_idx].predicates)->type == LY_PATH_PREDTYPE_POSITION)) {
        plVar16 = parent_local;
        if (node != (lyd_node *)0x0) {
          if ((node->schema == (lysc_node *)0x0) || ((node->schema->nodetype & 0x711) != 0)) {
            plVar16 = *(lyd_node **)(node + 1);
          }
          else {
            plVar16 = (lyd_node *)0x0;
          }
        }
        uVar23 = 0;
        lyd_find_sibling_val(plVar16,plVar10,(char *)0x0,0,&iter);
        if (iter != (lyd_node *)0x0) {
          uVar23 = 0;
          do {
            if (iter->schema != p[path_idx].node) break;
            uVar23 = (ulong)((int)uVar23 + 1);
            iter = iter->next;
          } while (iter != (lyd_node *)0x0);
        }
        iVar8 = (int)uVar23;
        uVar6 = ((p[path_idx].predicates)->field_1).position;
        if (iVar8 + 1 < uVar6) {
          pcVar17 = (p[path_idx].node)->name;
          if (iVar8 == 0) {
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                    "Cannot create \"%s\" on position %lu, no instances exist.",pcVar17);
          }
          else {
            pcVar18 = "";
            pcVar19 = "s";
            if (iVar8 == 1) {
              pcVar19 = "";
              pcVar18 = "s";
            }
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                    "Cannot create \"%s\" on position %lu, only %u instance%s exist%s.",pcVar17,
                    uVar6,uVar23,pcVar19,pcVar18);
          }
          LVar7 = LY_EINVAL;
          goto LAB_0012eab0;
        }
      }
    }
  }
  local_88 = (lysc_ext_instance *)0x1da9d3;
  if (local_c0 != (lysc_ext_instance *)0x0) {
    local_88 = local_c0;
  }
  local_80 = CONCAT44(local_80._4_4_,(uint)((byte)options >> 1 & 1));
  local_98 = (lyd_value *)0x0;
  plVar11 = local_c0;
  while( true ) {
    plVar16 = node;
    if (p == (ly_path *)0x0) {
      plVar13 = (ly_path_predicate *)0x0;
    }
    else {
      plVar13 = p[-1].predicates;
    }
    if (plVar13 <= path_idx) goto LAB_0012f6d1;
    plVar10 = p[path_idx].node;
    uVar4 = plVar10->nodetype;
    if (0x1f < uVar4) break;
    if (uVar4 < 8) {
      if (uVar4 == 1) {
LAB_0012f2a6:
        LVar7 = lyd_create_inner(plVar10,&node);
        if (LVar7 == LY_SUCCESS) goto LAB_0012f534;
        LVar7 = LY_EMEM;
        goto LAB_0012eab0;
      }
      if (uVar4 != 4) goto LAB_0012f6e4;
      if (((plVar10->flags & 0x100) == 0) || (node->schema == (lysc_node *)0x0)) {
        if ((options & 0x40) != 0) {
          if ((node == (lyd_node *)0x0) || (node->schema != (lysc_node *)0x0)) {
            LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,(char *)local_88,local_a8,
                                       (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0);
          }
          else {
            LVar7 = LY_ENOT;
          }
          if ((LVar7 != LY_SUCCESS) && (LVar7 != LY_EINCOMPLETE)) {
            hints = 0;
            if ((plVar11 != (lysc_ext_instance *)0x0) && (format == LY_VALUE_JSON)) {
              iVar8 = ly_strncmp("[null]",(char *)local_c0,local_a8);
              uVar21 = (uint)(iVar8 == 0);
              goto LAB_0012f5d6;
            }
            goto LAB_0012f5da;
          }
        }
        LVar7 = lyd_create_term(plVar10,(char *)plVar11,local_a8,'\0',(ly_bool)local_80,
                                (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&node);
        goto joined_r0x0012f43b;
      }
      if ((node == (lyd_node *)0x0) || ((node->schema->nodetype & 0x711) == 0)) {
        plVar16 = (lyd_node *)0x0;
      }
      else {
        plVar16 = *(lyd_node **)(node + 1);
      }
      lyd_find_sibling_schema(plVar16,plVar10,&node);
      if (node == (lyd_node *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                      ,0x71d,
                      "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                     );
      }
    }
    else {
      if (uVar4 != 8) {
        if (uVar4 != 0x10) goto LAB_0012f6e4;
        if ((plVar10->flags >> 9 & 1) == 0) {
          if (((options & 0x40) == 0) || (p[path_idx].predicates != (ly_path_predicate *)0x0)) {
            LVar7 = lyd_create_list(plVar10,p[path_idx].predicates,(lyxp_var *)0x0,(ly_bool)local_80
                                    ,&node);
          }
          else {
            pcVar17 = plVar10->name;
            local_b0 = (ly_path_predicate *)strlen(pcVar17);
            pcVar19 = plVar10->module->name;
            sVar9 = strlen(pcVar19);
            LVar7 = lyd_create_opaq(ctx,pcVar17,(size_t)local_b0,(char *)0x0,0,pcVar19,sVar9,
                                    (char *)0x0,0,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x80,
                                    &node);
          }
          goto joined_r0x0012f43b;
        }
        goto LAB_0012f2a6;
      }
      if (((options & 0x40) != 0) &&
         ((p[path_idx].predicates == (ly_path_predicate *)0x0 ||
          ((p[path_idx].predicates)->type != LY_PATH_PREDTYPE_LEAFLIST)))) {
        LVar7 = LY_EVALID;
        if ((plVar10->flags & 1) == 0) {
          LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,(char *)local_88,local_a8,(lyd_node *)0x0
                                     ,(lysc_type **)0x0,(char **)0x0);
        }
        if ((LVar7 != LY_SUCCESS) && (LVar7 != LY_EINCOMPLETE)) {
          hints = 0x100;
          if ((plVar11 != (lysc_ext_instance *)0x0) && (format == LY_VALUE_JSON)) {
            iVar8 = ly_strncmp("[null]",(char *)local_c0,local_a8);
            uVar21 = iVar8 == 0 | 4;
LAB_0012f5d6:
            hints = uVar21 << 6;
          }
LAB_0012f5da:
          pcVar17 = plVar10->name;
          local_b0 = (ly_path_predicate *)strlen(pcVar17);
          pcVar19 = plVar10->module->name;
          sVar9 = strlen(pcVar19);
          plVar11 = local_c0;
          LVar7 = lyd_create_opaq(ctx,pcVar17,(size_t)local_b0,(char *)0x0,0,pcVar19,sVar9,
                                  (char *)local_c0,local_a8,(ly_bool *)0x0,format,(void *)0x0,hints,
                                  &node);
          if (LVar7 == LY_SUCCESS) goto LAB_0012f534;
          goto LAB_0012eab0;
        }
      }
      plVar13 = p[path_idx].predicates;
      val = local_98;
      if ((plVar13 != (ly_path_predicate *)0x0) && (plVar13->type == LY_PATH_PREDTYPE_LEAFLIST)) {
        val = (lyd_value *)&(plVar13->field_1).field_1.field_1;
      }
      if (val == (lyd_value *)0x0) {
        LVar7 = lyd_create_term(plVar10,(char *)plVar11,local_a8,'\0',(ly_bool)local_80,
                                (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&node);
        local_98 = (lyd_value *)0x0;
      }
      else {
        local_98 = val;
        LVar7 = lyd_create_term2(plVar10,val,&node);
      }
joined_r0x0012f43b:
      if (LVar7 != LY_SUCCESS) goto LAB_0012eab0;
LAB_0012f534:
      if (p[path_idx].ext != (lysc_ext_instance *)0x0) {
        node->flags = node->flags | 8;
      }
      if (plVar16 == (lyd_node *)0x0) {
        if (parent_local == (lyd_node *)0x0) goto LAB_0012f57f;
        plVar16 = (lyd_node *)0x0;
        first_sibling_p = &parent_local;
      }
      else {
        first_sibling_p = (lyd_node **)0x0;
      }
      lyd_insert_node(plVar16,first_sibling_p,node,0);
    }
LAB_0012f57f:
    if (nparent == (lyd_node *)0x0) {
      nparent = node;
    }
    nnode = node;
    path_idx = path_idx + 1;
  }
  if (uVar4 < 0x100) {
    if ((uVar4 == 0x20) || (uVar4 == 0x60)) {
      LVar7 = lyd_create_any(plVar10,plVar11,value_type,(ly_bool)local_70,&node);
      goto joined_r0x0012f43b;
    }
  }
  else if (((uVar4 == 0x100) || (uVar4 == 0x200)) || (uVar4 == 0x400)) goto LAB_0012f2a6;
LAB_0012f6e4:
  LVar7 = LY_EINT;
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c",
         0x73e);
LAB_0012eab0:
  lyxp_expr_free(ctx,exp);
  if ((p != (ly_path *)0x0) && (p[-1].predicates < plVar24)) {
    plVar13 = (ly_path_predicate *)((long)&(p[-1].predicates)->type + 1);
    if (plVar13 < plVar24) {
      plVar13 = plVar24;
    }
    p[-1].predicates = plVar13;
  }
  ly_path_free(p);
  if (LVar7 == LY_SUCCESS) {
    if (new_parent != (lyd_node **)0x0) {
      *new_parent = nparent;
    }
    if (new_node != (lyd_node **)0x0) {
      *new_node = nnode;
    }
  }
  else {
    lyd_free_tree(nparent);
  }
  return LVar7;
}

Assistant:

static LY_ERR
lyd_new_path_(struct lyd_node *parent, const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, const char *path,
        const void *value, size_t value_len, LYD_ANYDATA_VALUETYPE value_type, uint32_t options,
        struct lyd_node **new_parent, struct lyd_node **new_node)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lyxp_expr *exp = NULL;
    struct ly_path *p = NULL;
    struct lyd_node *nparent = NULL, *nnode = NULL, *node = NULL, *cur_parent, *iter;
    const struct lysc_node *schema;
    const struct lyd_value *val = NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    ly_bool any_use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;
    LY_ARRAY_COUNT_TYPE path_idx = 0, orig_count = 0;
    LY_VALUE_FORMAT format;
    uint32_t hints, count;

    assert(parent || ctx);
    assert(path && ((path[0] == '/') || parent));

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (value && !value_len) {
        value_len = strlen(value);
    }
    LY_CHECK_GOTO(ret = lyd_new_val_get_format(options, &format), cleanup);

    /* parse path */
    LY_CHECK_GOTO(ret = ly_path_parse(ctx, NULL, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &exp), cleanup);

    /* compile path */
    LY_CHECK_GOTO(ret = ly_path_compile(ctx, NULL, lyd_node_schema(parent), ext, exp, options & LYD_NEW_VAL_OUTPUT ?
            LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p), cleanup);

    /* check the compiled path before searching existing nodes, it may be shortened */
    orig_count = LY_ARRAY_COUNT(p);
    LY_CHECK_GOTO(ret = lyd_new_path_check_find_lypath(p, path, value, value_len, format, options), cleanup);

    /* try to find any existing nodes in the path */
    if (parent) {
        r = ly_path_eval_partial(p, parent, NULL, options & LYD_NEW_PATH_WITH_OPAQ, &path_idx, &node);
        if (r == LY_SUCCESS) {
            if (orig_count == LY_ARRAY_COUNT(p)) {
                /* the node exists, are we supposed to update it or is it just a default? */
                if (!(options & LYD_NEW_PATH_UPDATE) && !(node->flags & LYD_DEFAULT)) {
                    LOG_LOCSET(NULL, node);
                    LOGVAL(ctx, LYVE_REFERENCE, "Path \"%s\" already exists.", path);
                    LOG_LOCBACK(0, 1);
                    ret = LY_EEXIST;
                    goto cleanup;
                } else if ((options & LYD_NEW_PATH_UPDATE) && lysc_is_key(node->schema)) {
                    /* fine, the key value must not be changed and has to be in the predicate to be found */
                    goto cleanup;
                }

                /* update the existing node */
                ret = lyd_new_path_update(node, value, value_len, value_type, format, &nparent, &nnode);
                goto cleanup;
            } /* else we were not searching for the whole path */
        } else if (r == LY_EINCOMPLETE) {
            /* some nodes were found, adjust the iterator to the next segment to be created */
            ++path_idx;
        } else if (r == LY_ENOTFOUND) {
            /* we will create the nodes from top-level, default behavior (absolute path), or from the parent (relative path) */
            if (lysc_data_parent(p[0].node)) {
                node = parent;
            }
        } else {
            /* error */
            ret = r;
            goto cleanup;
        }
    }

    /* restore the full path for creating new nodes */
    while (orig_count > LY_ARRAY_COUNT(p)) {
        LY_ARRAY_INCREMENT(p);
    }

    if ((path_idx < LY_ARRAY_COUNT(p)) && lysc_is_dup_inst_list(p[path_idx].node) && p[path_idx].predicates &&
            (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_POSITION)) {
        /* check the used position of a key-less list or state leaf-list */
        count = 0;
        LYD_LIST_FOR_INST(node ? lyd_child(node) : parent, p[path_idx].node, iter) {
            ++count;
        }

        if (count + 1 < p[path_idx].predicates[0].position) {
            if (count) {
                LOGVAL(ctx, LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %" PRIu64 ", only %" PRIu32 " instance%s exist%s.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position, count, (count > 1) ? "s" : "",
                        (count > 1) ? "" : "s");
            } else {
                LOGVAL(ctx, LYVE_REFERENCE, "Cannot create \"%s\" on position %" PRIu64 ", no instances exist.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position);
            }
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* create all the non-existing nodes in a loop */
    for ( ; path_idx < LY_ARRAY_COUNT(p); ++path_idx) {
        cur_parent = node;
        schema = p[path_idx].node;

        switch (schema->nodetype) {
        case LYS_LIST:
            if (lysc_is_dup_inst_list(schema)) {
                /* create key-less list instance */
                LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            } else if ((options & LYD_NEW_PATH_OPAQ) && !p[path_idx].predicates) {
                /* creating opaque list without keys */
                LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                        schema->module->name, strlen(schema->module->name), NULL, 0, NULL, LY_VALUE_JSON, NULL,
                        LYD_NODEHINT_LIST, &node), cleanup);
            } else {
                /* create standard list instance */
                LY_CHECK_GOTO(ret = lyd_create_list(schema, p[path_idx].predicates, NULL, store_only, &node), cleanup);
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            break;
        case LYS_LEAFLIST:
            if ((options & LYD_NEW_PATH_OPAQ) &&
                    (!p[path_idx].predicates || (p[path_idx].predicates[0].type != LY_PATH_PREDTYPE_LEAFLIST))) {
                /* we have not checked this only for dup-inst lists, otherwise it must be opaque */
                r = LY_EVALID;
                if (lysc_is_dup_inst_list(schema)) {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf-list */
                    hints = LYD_NODEHINT_LEAFLIST;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL,
                            hints, &node), cleanup);
                    break;
                }
            }

            /* get value to set */
            if (p[path_idx].predicates && (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_LEAFLIST)) {
                val = &p[path_idx].predicates[0].value;
            }

            /* create a leaf-list instance */
            if (val) {
                LY_CHECK_GOTO(ret = lyd_create_term2(schema, val, &node), cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            }
            break;
        case LYS_LEAF:
            if (lysc_is_key(schema) && cur_parent->schema) {
                /* it must have been already created or some error will occur later */
                lyd_find_sibling_schema(lyd_child(cur_parent), schema, &node);
                assert(node);
                goto next_iter;
            }

            if (options & LYD_NEW_PATH_OPAQ) {
                if (cur_parent && !cur_parent->schema) {
                    /* always create opaque nodes for opaque parents */
                    r = LY_ENOT;
                } else {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf */
                    hints = 0;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL, hints, &node),
                            cleanup);
                    break;
                }
            }

            /* create a leaf instance */
            LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_GOTO(ret = lyd_create_any(schema, value, value_type, any_use_value, &node), cleanup);
            break;
        default:
            LOGINT(ctx);
            ret = LY_EINT;
            goto cleanup;
        }

        if (p[path_idx].ext) {
            node->flags |= LYD_EXT;
        }
        if (cur_parent) {
            /* connect to the parent */
            lyd_insert_node(cur_parent, NULL, node, LYD_INSERT_NODE_DEFAULT);
        } else if (parent) {
            /* connect to top-level siblings */
            lyd_insert_node(NULL, &parent, node, LYD_INSERT_NODE_DEFAULT);
        }

next_iter:
        /* update remembered nodes */
        if (!nparent) {
            nparent = node;
        }
        nnode = node;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (p) {
        while (orig_count > LY_ARRAY_COUNT(p)) {
            LY_ARRAY_INCREMENT(p);
        }
    }
    ly_path_free(p);
    if (!ret) {
        /* set out params only on success */
        if (new_parent) {
            *new_parent = nparent;
        }
        if (new_node) {
            *new_node = nnode;
        }
    } else {
        lyd_free_tree(nparent);
    }
    return ret;
}